

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

float __thiscall V2Synth::getmodsource(V2Synth *this,V2Voice *voice,int chan,int source)

{
  float fVar1;
  
  switch(source) {
  case 0:
    return voice->velo;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    return (float)this->chans[chan].ctl[source - 1];
  case 8:
  case 9:
    return voice->env[source - 8].out;
  case 10:
  case 0xb:
    return voice->lfo[source - 10].out;
  default:
    fVar1 = (float)voice->note + -48.0;
    return fVar1 + fVar1;
  }
}

Assistant:

float getmodsource(const V2Voice *voice, int chan, int source) const
    {
        float in = 0.0f;

        switch (source)
        {
        case 0: // velocity
            COVER("MOD src vel");
            in = voice->velo;
            break;

        case 1: case 2: case 3: case 4: case 5: case 6: case 7: // controller value
            COVER("MOD src ctl");
            in = chans[chan].ctl[source-1];
            break;

        case 8: case 9: // EG output
            COVER("MOD src EG");
            in = voice->env[source-8].out;
            break;

        case 10: case 11: // LFO output
            COVER("MOD src LFO");
            in = voice->lfo[source-10].out;
            break;

        default: // note
            COVER("MOD src note");
            in = 2.0f * (voice->note - 48.0f);
            break;
        }

        return in;
    }